

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

void __thiscall cdnsBlockTables::~cdnsBlockTables(cdnsBlockTables *this)

{
  cdnsBlockTables *this_local;
  
  std::vector<cdns_rr_field,_std::allocator<cdns_rr_field>_>::~vector(&this->rrs);
  std::vector<cdns_rr_list,_std::allocator<cdns_rr_list>_>::~vector(&this->rr_list);
  std::vector<cdns_question,_std::allocator<cdns_question>_>::~vector(&this->qrr);
  std::vector<cdns_question_list,_std::allocator<cdns_question_list>_>::~vector
            (&this->question_list);
  std::vector<cdns_query_signature,_std::allocator<cdns_query_signature>_>::~vector(&this->q_sigs);
  std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::~vector(&this->name_rdata);
  std::vector<cdns_class_id,_std::allocator<cdns_class_id>_>::~vector(&this->class_ids);
  std::vector<cbor_bytes,_std::allocator<cbor_bytes>_>::~vector(&this->addresses);
  return;
}

Assistant:

cdnsBlockTables::~cdnsBlockTables()
{
}